

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O2

uint16_t * GetCostModeI4(VP8EncIterator *it,uint8_t *modes)

{
  int iVar1;
  uint uVar2;
  byte *pbVar3;
  uint uVar4;
  uint8_t *puVar5;
  
  iVar1 = it->enc_->preds_w_;
  uVar2 = it->i4_;
  puVar5 = modes;
  uVar4 = uVar2;
  if ((uVar2 & 3) == 0) {
    puVar5 = it->preds_;
    uVar4 = ((int)uVar2 >> 2) * iVar1;
  }
  if (uVar2 < 4) {
    pbVar3 = it->preds_ + (int)((uVar2 & 3) - iVar1);
  }
  else {
    pbVar3 = modes + (long)(int)uVar2 + -4;
  }
  return VP8FixedCostsI4[*pbVar3][puVar5[(long)(int)uVar4 + -1]];
}

Assistant:

static const uint16_t* GetCostModeI4(VP8EncIterator* const it,
                                     const uint8_t modes[16]) {
  const int preds_w = it->enc_->preds_w_;
  const int x = (it->i4_ & 3), y = it->i4_ >> 2;
  const int left = (x == 0) ? it->preds_[y * preds_w - 1] : modes[it->i4_ - 1];
  const int top = (y == 0) ? it->preds_[-preds_w + x] : modes[it->i4_ - 4];
  return VP8FixedCostsI4[top][left];
}